

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

void __thiscall World::~World(World *this)

{
  pointer ppMVar1;
  Map *this_00;
  pointer ppHVar2;
  Home *this_01;
  void *pvVar3;
  EIF *pEVar4;
  ENF *pEVar5;
  ESF *pEVar6;
  ECF *pEVar7;
  GuildManager *this_02;
  bool bVar8;
  mapped_type *this_03;
  pointer ppHVar9;
  long lVar10;
  pointer ppMVar11;
  allocator local_59;
  vector<Map_*,_std::allocator<Map_*>_> *local_58;
  key_type local_50;
  
  local_58 = &this->maps;
  ppMVar1 = (this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar11 = (this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppMVar11 != ppMVar1; ppMVar11 = ppMVar11 + 1) {
    this_00 = *ppMVar11;
    if (this_00 != (Map *)0x0) {
      Map::~Map(this_00);
    }
    operator_delete(this_00,0xd8);
  }
  ppHVar2 = (this->homes).super__Vector_base<Home_*,_std::allocator<Home_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppHVar9 = (this->homes).super__Vector_base<Home_*,_std::allocator<Home_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppHVar9 != ppHVar2; ppHVar9 = ppHVar9 + 1) {
    this_01 = *ppHVar9;
    if (this_01 != (Home *)0x0) {
      Home::~Home(this_01);
    }
    operator_delete(this_01,0x50);
  }
  for (lVar10 = 0; lVar10 != 0x40; lVar10 = lVar10 + 8) {
    pvVar3 = *(void **)((long)(this->boards)._M_elems + lVar10);
    if (pvVar3 != (void *)0x0) {
      std::__cxx11::_List_base<Board_Post_*,_std::allocator<Board_Post_*>_>::_M_clear
                ((_List_base<Board_Post_*,_std::allocator<Board_Post_*>_> *)((long)pvVar3 + 8));
    }
    operator_delete(pvVar3,0x20);
  }
  pEVar4 = this->eif;
  if (pEVar4 != (EIF *)0x0) {
    std::vector<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>::~vector(&pEVar4->data);
  }
  operator_delete(pEVar4,0x20);
  pEVar5 = this->enf;
  if (pEVar5 != (ENF *)0x0) {
    std::vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>::~vector(&pEVar5->data);
  }
  operator_delete(pEVar5,0x20);
  pEVar6 = this->esf;
  if (pEVar6 != (ESF *)0x0) {
    std::vector<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>::~vector(&pEVar6->data);
  }
  operator_delete(pEVar6,0x20);
  pEVar7 = this->ecf;
  if (pEVar7 != (ECF *)0x0) {
    std::vector<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_>::~vector(&pEVar7->data);
  }
  operator_delete(pEVar7,0x20);
  this_02 = this->guildmanager;
  if (this_02 != (GuildManager *)0x0) {
    GuildManager::~GuildManager(this_02);
  }
  operator_delete(this_02,0x80);
  std::__cxx11::string::string((string *)&local_50,"TimedSave",&local_59);
  this_03 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->config,&local_50);
  bVar8 = util::variant::GetBool(this_03);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar8) {
    Database::Commit(&this->db);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->instrument_ids).super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<short,_std::pair<const_short,_std::shared_ptr<Quest>_>,_std::_Select1st<std::pair<const_short,_std::shared_ptr<Quest>_>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest>_>_>_>
  ::~_Rb_tree(&(this->quests)._M_t);
  std::_Vector_base<Home_*,_std::allocator<Home_*>_>::~_Vector_base
            (&(this->homes).super__Vector_base<Home_*,_std::allocator<Home_*>_>);
  std::_Vector_base<Map_*,_std::allocator<Map_*>_>::~_Vector_base
            (&local_58->super__Vector_base<Map_*,_std::allocator<Map_*>_>);
  std::_Vector_base<Party_*,_std::allocator<Party_*>_>::~_Vector_base
            (&(this->parties).super__Vector_base<Party_*,_std::allocator<Party_*>_>);
  std::_Vector_base<Character_*,_std::allocator<Character_*>_>::~_Vector_base
            (&(this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>);
  I18N::~I18N(&this->i18n);
  Config::~Config(&this->skills_config);
  Config::~Config(&this->home_config);
  Config::~Config(&this->formulas_config);
  Config::~Config(&this->arenas_config);
  Config::~Config(&this->shops_config);
  Config::~Config(&this->drops_config);
  Config::~Config(&this->admin_config);
  Config::~Config(&this->config);
  std::
  vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
  ::~vector(&this->npc_data);
  Database::~Database(&this->db);
  Timer::~Timer(&this->timer);
  return;
}

Assistant:

World::~World()
{
	UTIL_FOREACH(this->maps, map)
	{
		delete map;
	}

	UTIL_FOREACH(this->homes, home)
	{
		delete home;
	}

	UTIL_FOREACH(this->boards, board)
	{
		delete board;
	}

	delete this->eif;
	delete this->enf;
	delete this->esf;
	delete this->ecf;

	delete this->guildmanager;

	if (this->config["TimedSave"])
	{
		this->db.Commit();
	}
}